

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::removedCoVec(SPxSteepPR<double> *this,int i)

{
  double *pdVar1;
  long in_RDI;
  VectorBase<double> *unaff_retaddr;
  VectorBase<double> *coWeights;
  int n;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  VectorBase<double> *this_00;
  
  n = (int)((ulong)(*(long *)(in_RDI + 0x10) + 0x8c8) >> 0x20);
  VectorBase<double>::dim((VectorBase<double> *)0x2ad109);
  pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffffd0,n);
  this_00 = (VectorBase<double> *)*pdVar1;
  pdVar1 = VectorBase<double>::operator[](this_00,n);
  *pdVar1 = (double)this_00;
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2ad151);
  VectorBase<double>::reDim
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVec(int i)
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   coWeights[i] = coWeights[coWeights.dim()];
   coWeights.reDim(this->thesolver->dim());
}